

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O1

int Aig_ManChoiceNum(Aig_Man_t *p)

{
  void *pvVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  
  lVar3 = (long)p->vObjs->nSize;
  if (0 < lVar3) {
    lVar4 = 0;
    iVar2 = 0;
    do {
      pvVar1 = p->vObjs->pArray[lVar4];
      if ((pvVar1 != (void *)0x0) && (0xfffffffd < ((uint)*(ulong *)((long)pvVar1 + 0x18) & 7) - 7))
      {
        uVar5 = 0;
        if ((p->pEquivs != (Aig_Obj_t **)0x0) &&
           (uVar5 = 0, p->pEquivs[*(int *)((long)pvVar1 + 0x24)] != (Aig_Obj_t *)0x0)) {
          uVar5 = (uint)((*(ulong *)((long)pvVar1 + 0x18) & 0xffffffc0) != 0);
        }
        iVar2 = iVar2 + uVar5;
      }
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
    return iVar2;
  }
  return 0;
}

Assistant:

int Aig_ManChoiceNum( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    Aig_ManForEachNode( p, pObj, i )
        Counter += Aig_ObjIsChoice( p, pObj );
    return Counter;
}